

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O1

string * __thiscall
cmServerBufferStrategy::BufferOutMessage
          (string *__return_storage_ptr__,cmServerBufferStrategy *this,string *rawBuffer)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\n","");
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_50,(ulong)kSTART_MAGIC_abi_cxx11_._M_dataplus._M_p);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_e0 = *puVar5;
    uStack_d8 = (undefined4)plVar3[3];
    uStack_d4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\n","");
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < (ulong)(local_88 + local_e8)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if (uVar7 < (ulong)(local_88 + local_e8)) goto LAB_0046a07e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0046a07e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90);
  }
  local_110 = &local_100;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_100 = *plVar3;
    uStack_f8 = puVar4[3];
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)(rawBuffer->_M_dataplus)._M_p);
  local_70 = &local_60;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)kEND_MAGIC_abi_cxx11_._M_dataplus._M_p);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_c0 = *puVar5;
    uStack_b8 = (undefined4)plVar3[3];
    uStack_b4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar5;
    local_d0 = (ulong *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\n","");
  uVar7 = 0xf;
  if (local_d0 != &local_c0) {
    uVar7 = local_c0;
  }
  if (uVar7 < (ulong)(local_a8 + local_c8)) {
    uVar7 = 0xf;
    if (local_b0 != local_a0) {
      uVar7 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0046a22a;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_0046a22a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmServerBufferStrategy::BufferOutMessage(
  const std::string& rawBuffer) const
{
  return std::string("\n") + kSTART_MAGIC + std::string("\n") + rawBuffer +
    kEND_MAGIC + std::string("\n");
}